

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

ssize_t mqtt_unpack_fixed_header(mqtt_response *response,uint8_t *buf,size_t bufsz)

{
  mqtt_fixed_header *pmVar1;
  byte *pbVar2;
  ssize_t errcode;
  int lshift;
  uint8_t *start;
  mqtt_fixed_header *fixed_header;
  size_t bufsz_local;
  uint8_t *buf_local;
  mqtt_response *response_local;
  
  if ((response == (mqtt_response *)0x0) || (buf == (uint8_t *)0x0)) {
    response_local = (mqtt_response *)0xffffffff80000001;
  }
  else if (bufsz == 0) {
    response_local = (mqtt_response *)0x0;
  }
  else {
    (response->fixed_header).control_type = (int)(uint)*buf >> 4;
    (response->fixed_header).field_0x4 = (response->fixed_header).field_0x4 & 0xf0 | *buf & 0xf;
    (response->fixed_header).remaining_length = 0;
    errcode._4_4_ = 0;
    pmVar1 = (mqtt_fixed_header *)bufsz;
    pbVar2 = buf;
    do {
      bufsz_local = (size_t)pbVar2;
      fixed_header = pmVar1;
      if (errcode._4_4_ == 0x1c) {
        return -0x7fffffe6;
      }
      pmVar1 = (mqtt_fixed_header *)((long)&fixed_header[-1].remaining_length + 3);
      pbVar2 = (byte *)(bufsz_local + 1);
      if (pmVar1 == (mqtt_fixed_header *)0x0) {
        return 0;
      }
      (response->fixed_header).remaining_length =
           ((*pbVar2 & 0x7f) << ((byte)errcode._4_4_ & 0x1f)) +
           (response->fixed_header).remaining_length;
      errcode._4_4_ = errcode._4_4_ + 7;
    } while ((*pbVar2 & 0x80) != 0);
    response_local = (mqtt_response *)mqtt_fixed_header_rule_violation(&response->fixed_header);
    if (response_local == (mqtt_response *)0x0) {
      if ((undefined1 *)((long)&fixed_header[-1].remaining_length + 2U) <
          (undefined1 *)(ulong)(response->fixed_header).remaining_length) {
        response_local = (mqtt_response *)0x0;
      }
      else {
        response_local = (mqtt_response *)((bufsz_local + 2) - (long)buf);
      }
    }
  }
  return (ssize_t)response_local;
}

Assistant:

ssize_t mqtt_unpack_fixed_header(struct mqtt_response *response, const uint8_t *buf, size_t bufsz) {
    struct mqtt_fixed_header *fixed_header;
    const uint8_t *start = buf;
    int lshift;
    ssize_t errcode;
    
    /* check for null pointers or empty buffer */
    if (response == NULL || buf == NULL) {
        return MQTT_ERROR_NULLPTR;
    }
    fixed_header = &(response->fixed_header);

    /* check that bufsz is not zero */
    if (bufsz == 0) return 0;

    /* parse control type and flags */
    fixed_header->control_type  = (enum MQTTControlPacketType) (*buf >> 4);
    fixed_header->control_flags = (uint8_t) (*buf & 0x0F);

    /* parse remaining size */
    fixed_header->remaining_length = 0;

    lshift = 0;
    do {

        /* MQTT spec (2.2.3) says the maximum length is 28 bits */
        if(lshift == 28)
            return MQTT_ERROR_INVALID_REMAINING_LENGTH;

        /* consume byte and assert at least 1 byte left */
        --bufsz;
        ++buf;
        if (bufsz == 0) return 0;

        /* parse next byte*/
        fixed_header->remaining_length += (uint32_t) ((*buf & 0x7F) << lshift);
        lshift += 7;
    } while(*buf & 0x80); /* while continue bit is set */ 

    /* consume last byte */
    --bufsz;
    ++buf;

    /* check that the fixed header is valid */
    errcode = mqtt_fixed_header_rule_violation(fixed_header);
    if (errcode) {
        return errcode;
    }

    /* check that the buffer size if GT remaining length */
    if (bufsz < fixed_header->remaining_length) {
        return 0;
    }

    /* return how many bytes were consumed */
    return buf - start;
}